

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmtime_s.c
# Opt level: O3

int main(void)

{
  tm *ptVar1;
  tm time;
  time_t t;
  tm local_34;
  time_t local_10;
  
  local_10 = -0x80000000;
  _PDCLIB_gmtcheck();
  ptVar1 = _PDCLIB_gmtsub(&_PDCLIB_gmtmem,&local_10,0,&local_34);
  if (ptVar1 == (tm *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x2b,"gmtime_s( &t, &time ) != NULL");
  }
  if (local_34.tm_sec != 0x34) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x2c,"time.tm_sec == 52");
  }
  if (local_34.tm_min != 0x2d) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x2d,"time.tm_min == 45");
  }
  if (local_34.tm_hour != 0x14) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x2e,"time.tm_hour == 20");
  }
  if (local_34.tm_mday != 0xd) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x2f,"time.tm_mday == 13");
  }
  if (local_34.tm_mon != 0xb) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x30,"time.tm_mon == 11");
  }
  if (local_34.tm_year != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x31,"time.tm_year == 1");
  }
  if (local_34.tm_wday != 5) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x32,"time.tm_wday == 5");
  }
  if (local_34.tm_yday != 0x15a) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x33,"time.tm_yday == 346");
  }
  local_10 = 0x7fffffff;
  _PDCLIB_gmtcheck();
  ptVar1 = _PDCLIB_gmtsub(&_PDCLIB_gmtmem,&local_10,0,&local_34);
  if (ptVar1 == (tm *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x36,"gmtime_s( &t, &time ) != NULL");
  }
  if (local_34.tm_sec != 7) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x37,"time.tm_sec == 7");
  }
  if (local_34.tm_min != 0xe) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x38,"time.tm_min == 14");
  }
  if (local_34.tm_hour != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x39,"time.tm_hour == 3");
  }
  if (local_34.tm_mday != 0x13) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x3a,"time.tm_mday == 19");
  }
  if (local_34.tm_mon != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x3b,"time.tm_mon == 0");
  }
  if (local_34.tm_year != 0x8a) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x3c,"time.tm_year == 138");
  }
  if (local_34.tm_wday != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x3d,"time.tm_wday == 2");
  }
  if (local_34.tm_yday != 0x12) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/gmtime_s.c, line %d - %s\n"
           ,0x3e,"time.tm_yday == 18");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    time_t t;
    struct tm time;

    /* TODO: Constraint handling */

    t = -2147483648l;
    TESTCASE( gmtime_s( &t, &time ) != NULL );
    TESTCASE( time.tm_sec == 52 );
    TESTCASE( time.tm_min == 45 );
    TESTCASE( time.tm_hour == 20 );
    TESTCASE( time.tm_mday == 13 );
    TESTCASE( time.tm_mon == 11 );
    TESTCASE( time.tm_year == 1 );
    TESTCASE( time.tm_wday == 5 );
    TESTCASE( time.tm_yday == 346 );

    t = 2147483647l;
    TESTCASE( gmtime_s( &t, &time ) != NULL );
    TESTCASE( time.tm_sec == 7 );
    TESTCASE( time.tm_min == 14 );
    TESTCASE( time.tm_hour == 3 );
    TESTCASE( time.tm_mday == 19 );
    TESTCASE( time.tm_mon == 0 );
    TESTCASE( time.tm_year == 138 );
    TESTCASE( time.tm_wday == 2 );
    TESTCASE( time.tm_yday == 18 );
#endif

    return TEST_RESULTS;
}